

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  Pl_StdioFile *this;
  size_t sVar5;
  ostream *poVar6;
  ostream *poVar7;
  string *psVar8;
  size_type extraout_RDX;
  bool bVar9;
  char *pcVar10;
  string difference;
  uchar buf [2048];
  string local_848;
  long *local_828 [2];
  long local_818 [254];
  
  pcVar1 = *argv;
  pcVar4 = strrchr(pcVar1,0x2f);
  pcVar10 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = pcVar1;
  }
  whoami = pcVar10;
  if (argc == 2) {
    iVar3 = strcmp(argv[1],"--version");
    if (iVar3 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,pcVar10);
      poVar7 = std::operator<<(poVar6," from qpdf version ");
      psVar8 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar6);
      poVar6 = std::operator<<(poVar7,psVar8);
      std::endl<char,std::char_traits<char>>(poVar6);
      exit(0);
    }
  }
  if (argc - 5U < 0xfffffffe) {
    usage();
    local_848._M_string_length = extraout_RDX;
  }
  else {
    local_828[0] = local_818;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"QPDF_COMPARE_WHY","");
    bVar2 = QUtil::get_env((string *)local_828,(string *)0x0);
    if (local_828[0] != local_818) {
      operator_delete(local_828[0],local_818[0] + 1);
    }
    pcVar1 = argv[1];
    pcVar10 = argv[2];
    if (argc == 4) {
      pcVar4 = argv[3];
    }
    else {
      pcVar4 = (char *)0x0;
    }
    compare_abi_cxx11_(&local_848,pcVar1,pcVar10,pcVar4);
    if ((bVar2 & local_848._M_string_length != 0) == 0) {
      if (local_848._M_string_length != 0) {
        pcVar10 = pcVar1;
      }
      __stream = (FILE *)QUtil::safe_fopen(pcVar10,"rb");
      QUtil::binary_stdout();
      this = (Pl_StdioFile *)operator_new(0x38);
      Pl_StdioFile::Pl_StdioFile(this,"stdout",_stdout);
      bVar9 = false;
      do {
        sVar5 = fread(local_828,1,0x800,__stream);
        if (sVar5 == 0) {
          bVar9 = true;
        }
        else {
          (**(code **)(*(long *)this + 0x10))(this,local_828,sVar5);
        }
      } while (!bVar9);
      if (local_848._M_string_length == 0) {
        (**(code **)(*(long *)this + 8))(this);
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        return 0;
      }
      goto LAB_00104cdd;
    }
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00104cdd:
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc < 3 || argc > 4) {
        usage();
    }

    bool show_why = QUtil::get_env("QPDF_COMPARE_WHY");
    try {
        char const* to_output;
        char const* actual = argv[1];
        char const* expected = argv[2];
        char const* password{nullptr};
        if (argc == 4) {
            password = argv[3];
        }
        auto difference = compare(actual, expected, password);
        if (difference.empty()) {
            // The files are identical; write the expected file. This way, tests can be written
            // that compare the output of this program to the expected file.
            to_output = expected;
        } else {
            if (show_why) {
                std::cerr << difference << std::endl;
                exit(2);
            }
            // The files differ; write the actual file. If it is determined that the actual file
            // is correct because of changes that result in intended differences, this enables
            // the output of this program to replace the expected file in the test suite.
            to_output = actual;
        }
        auto f = QUtil::safe_fopen(to_output, "rb");
        QUtil::FileCloser fc(f);
        QUtil::binary_stdout();
        auto out = std::make_unique<Pl_StdioFile>("stdout", stdout);
        unsigned char buf[2048];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                out->write(buf, len);
            }
        }
        if (!difference.empty()) {
            exit(2);
        }
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}